

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
_set_noalias<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *other)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other_00;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *other_local;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  pMVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                     ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  other_00 = EigenBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::derived
                       ((EigenBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                        other);
  pMVar1 = internal::
           assign_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_false,_false>
           ::run(pMVar1,other_00);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      return internal::assign_selector<Derived,OtherDerived,false>::run(this->derived(), other.derived());
    }